

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

void __thiscall
soplex::SoPlexBase<double>::printShortStatistics(SoPlexBase<double> *this,ostream *os)

{
  long lVar1;
  ostream *poVar2;
  double extraout_XMM0_Qa;
  double dVar3;
  
  printStatus(this,os,this->_status);
  lVar1 = *(long *)os;
  *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 8) = 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(os + lVar1 + 0x18) = *(uint *)(os + lVar1 + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(os,"Solving time (sec)  : ",0x16);
  (*this->_statistics->solvingTime->_vptr_Timer[6])();
  poVar2 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Iterations          : ",0x16);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->_statistics->iterations);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  lVar1 = *(long *)os;
  *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 8) = 8;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(os + lVar1 + 0x18) = *(uint *)(os + lVar1 + 0x18) & 0xfffffefb | 0x100;
  std::__ostream_insert<char,std::char_traits<char>>(os,"Objective value     : ",0x16);
  dVar3 = objValueReal(this);
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  return;
}

Assistant:

void SoPlexBase<R>::printShortStatistics(std::ostream& os)
{
   printStatus(os, _status);
   SPxOut::setFixed(os, 2);
   os << "Solving time (sec)  : " << this->_statistics->solvingTime->time() << "\n"
      << "Iterations          : " << this->_statistics->iterations << "\n";
   SPxOut::setScientific(os);
   os << "Objective value     : " << objValueReal() << "\n";
}